

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poly.cpp
# Opt level: O3

void __thiscall
MT32Emu::Poly::reset(Poly *this,uint newKey,uint newVelocity,bool newSustain,Partial **newPartials)

{
  PolyState PVar1;
  Partial *pPVar2;
  bool bVar3;
  Synth *this_00;
  long lVar4;
  int i;
  
  if (this->state != POLY_Inactive) {
    this_00 = Part::getSynth(this->part);
    Synth::printDebug(this_00,"Resetting active poly. Active partial count: %i\n",
                      (ulong)this->activePartialCount);
    lVar4 = 4;
    do {
      if (this->partials[lVar4 + -4] != (Partial *)0x0) {
        bVar3 = Partial::isActive(this->partials[lVar4 + -4]);
        if (bVar3) {
          Partial::deactivate(this->partials[lVar4 + -4]);
          this->activePartialCount = this->activePartialCount - 1;
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
    PVar1 = this->state;
    if (PVar1 != POLY_Inactive) {
      this->state = POLY_Inactive;
      (*this->part->_vptr_Part[10])(this->part,(ulong)PVar1,3);
    }
  }
  this->key = newKey;
  this->velocity = newVelocity;
  this->sustain = newSustain;
  this->activePartialCount = 0;
  lVar4 = 0;
  do {
    pPVar2 = newPartials[lVar4];
    this->partials[lVar4] = pPVar2;
    if (pPVar2 != (Partial *)0x0) {
      this->activePartialCount = this->activePartialCount + 1;
      PVar1 = this->state;
      if (PVar1 != POLY_Playing) {
        this->state = POLY_Playing;
        (*this->part->_vptr_Part[10])(this->part,(ulong)PVar1,0);
      }
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  return;
}

Assistant:

void Poly::reset(unsigned int newKey, unsigned int newVelocity, bool newSustain, Partial **newPartials) {
	if (isActive()) {
		// This should never happen
		part->getSynth()->printDebug("Resetting active poly. Active partial count: %i\n", activePartialCount);
		for (int i = 0; i < 4; i++) {
			if (partials[i] != NULL && partials[i]->isActive()) {
				partials[i]->deactivate();
				activePartialCount--;
			}
		}
		setState(POLY_Inactive);
	}

	key = newKey;
	velocity = newVelocity;
	sustain = newSustain;

	activePartialCount = 0;
	for (int i = 0; i < 4; i++) {
		partials[i] = newPartials[i];
		if (newPartials[i] != NULL) {
			activePartialCount++;
			setState(POLY_Playing);
		}
	}
}